

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

void NULLCTypeInfo::SetFunctionContext(NULLCRef obj,NULLCRef context)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  ExternFuncInfo *pEVar3;
  char *pcVar4;
  char *pcVar5;
  FastVector<char,_false,_false> *pFVar6;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_0000001c;
  ExternTypeInfo *contextRefType;
  ExternFuncInfo *function;
  NULLCFuncPtr *ptr;
  ExternTypeInfo *objectType;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    if (pEVar1->subCat == CAT_FUNCTION) {
      pEVar3 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                         ((FastVector<ExternFuncInfo,_false,_false> *)(linker + 0x240),
                          *(uint *)((undefined8 *)CONCAT124(obj,in_stack_0000000c) + 1));
      if (pEVar3->contextType == 0xffffffff) {
        pcVar2 = FastVector<char,_false,_false>::operator[]
                           ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar3->offsetToName)
        ;
        nullcThrowError("functionSetContext: function \'%s\' doesn\'t have a context",pcVar2);
      }
      else {
        pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                           ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                            pEVar3->contextType);
        if ((pEVar1->field_11).subType == obj.ptr._4_4_) {
          *(undefined8 *)CONCAT124(obj,in_stack_0000000c) =
               CONCAT44(context.typeID,in_stack_0000001c);
        }
        else {
          pFVar6 = (FastVector<char,_false,_false> *)(linker + 0x290);
          pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                             ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                              obj.ptr._4_4_);
          pcVar2 = FastVector<char,_false,_false>::operator[](pFVar6,pEVar1->offsetToName);
          pcVar4 = FastVector<char,_false,_false>::operator[]
                             ((FastVector<char,_false,_false> *)(linker + 0x290),
                              pEVar3->offsetToName);
          pFVar6 = (FastVector<char,_false,_false> *)(linker + 0x290);
          pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                             ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                              pEVar3->contextType);
          pcVar5 = FastVector<char,_false,_false>::operator[](pFVar6,pEVar1->offsetToName);
          nullcThrowError("functionSetContext: cannot set context of type \'%s\' to the function \'%s\' expecting context of type \'%s\'"
                          ,pcVar2,pcVar4,pcVar5);
        }
      }
    }
    else {
      pcVar2 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      nullcThrowError("functionSetContext: received type \'%s\' that is not a function",pcVar2);
    }
    return;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x17b,"void NULLCTypeInfo::SetFunctionContext(NULLCRef, NULLCRef)");
}

Assistant:

void SetFunctionContext(NULLCRef obj, NULLCRef context)
	{
		assert(linker);

		ExternTypeInfo &objectType = linker->exTypes[obj.typeID];

		if(objectType.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("functionSetContext: received type '%s' that is not a function", &linker->exSymbols[objectType.offsetToName]);
			return;
		}

		NULLCFuncPtr *ptr = (NULLCFuncPtr*)obj.ptr;

		ExternFuncInfo &function = linker->exFunctions[ptr->id];

		if(function.contextType == ~0u)
		{
			nullcThrowError("functionSetContext: function '%s' doesn't have a context", &linker->exSymbols[function.offsetToName]);
			return;
		}

		ExternTypeInfo &contextRefType = linker->exTypes[function.contextType];

		if(contextRefType.subType != context.typeID)
		{
			nullcThrowError("functionSetContext: cannot set context of type '%s' to the function '%s' expecting context of type '%s'", &linker->exSymbols[linker->exTypes[context.typeID].offsetToName], &linker->exSymbols[function.offsetToName], &linker->exSymbols[linker->exTypes[function.contextType].offsetToName]);
			return;
		}

		ptr->context = context.ptr;
	}